

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

HMBool hypermind::addEntry(Entry *entries,HMUINT32 capacity,Value key,Value value)

{
  HMBool HVar1;
  uint local_40;
  uint32_t index;
  HMUINT32 capacity_local;
  Entry *entries_local;
  Value value_local;
  Value key_local;
  
  value_local._0_8_ = value.field_1;
  value_local.field_1.intval = key.type;
  local_40 = Value::hash((Value *)&value_local.field_1);
  while( true ) {
    local_40 = local_40 % capacity;
    if (entries[local_40].key.type == Undefined) {
      *(ulong *)&entries[local_40].key =
           CONCAT44(value_local.field_1._4_4_,value_local.field_1.intval);
      entries[local_40].key.field_1 = key.field_1;
      *(ulong *)&entries[local_40].value = CONCAT44(entries_local._4_4_,value.type);
      entries[local_40].value.field_1 = (anon_union_8_3_be54641b_for_Value_1)value_local._0_8_;
      return true;
    }
    HVar1 = Value::equals(&entries[local_40].key,(Value *)&value_local.field_1);
    if (HVar1) break;
    local_40 = local_40 + 1;
  }
  *(ulong *)&entries[local_40].value = CONCAT44(entries_local._4_4_,value.type);
  entries[local_40].value.field_1 = (anon_union_8_3_be54641b_for_Value_1)value_local._0_8_;
  return false;
}

Assistant:

HMBool addEntry(Entry *entries, HMUINT32 capacity, Value key, Value value) {
        uint32_t index = key.hash() % capacity;
        while (true) {
            if (entries[index].key.type == ValueType::Undefined) {
                entries[index].key = key;
                entries[index].value = value;
                return true;       //新的key就返回true
            } else if (entries[index].key.equals(key)) { //key已经存在,仅仅更新值就行
                entries[index].value = value;
                return false;    // 未增加新的key就返回false
            }
            //开放探测定址,尝试下一个slot
            index = (index + 1) % capacity;
        }

    }